

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetGame(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  allocator local_71;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  type local_40;
  
  std::make_shared<TgBot::Game>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"title",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=(*(string **)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"description",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x20),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"photo",&local_71);
  parseJsonAndGetArray<TgBot::PhotoSize>
            ((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
              *)&local_40,(TgTypeParser *)data,0x1e42d0,(ptree *)0x0,&in_RDX->m_data);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  _M_move_assign((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                  *)(*(long *)this + 0x40),&local_40);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
           *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"text",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x58),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"text_entities",&local_71);
  parseJsonAndGetArray<TgBot::MessageEntity>
            ((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
              *)&local_40,(TgTypeParser *)data,0x1e3632,(ptree *)0x0,&in_RDX->m_data);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::_M_move_assign((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                    *)(*(long *)this + 0x78),&local_40);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
             *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"animation",&local_71);
  tryParseJson<TgBot::Animation>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Animation>)data,
             (ptree *)parseJsonAndGetAnimation,(string *)0x0);
  std::__shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x90),
             (__shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  PVar1.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar1.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Game::Ptr TgTypeParser::parseJsonAndGetGame(const ptree& data) const {
    auto result(make_shared<Game>());
    result->title = data.get("title", "");
    result->description = data.get("description", "");
    result->photo = parseJsonAndGetArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "photo");
    result->text = data.get("text", "");
    result->textEntities = parseJsonAndGetArray<MessageEntity>(&TgTypeParser::parseJsonAndGetMessageEntity, data, "text_entities");
    result->animation = tryParseJson<Animation>(&TgTypeParser::parseJsonAndGetAnimation, data, "animation");
    return result;
}